

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_iterator.hpp
# Opt level: O2

join_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>_>_>_>_>
* __thiscall
burst::
make_join_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>&>
          (join_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>_>_>_>_>
           *__return_storage_ptr__,burst *this,
          vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
          *ranges)

{
  detail::
  join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
  ::join_iterator_impl
            (__return_storage_ptr__,
             *(iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
               **)this,
             *(iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
               **)(this + 8));
  return __return_storage_ptr__;
}

Assistant:

auto make_join_iterator (Range && ranges)
    {
        using std::begin;
        using std::end;
        return
            make_join_iterator
            (
                begin(std::forward<Range>(ranges)),
                end(std::forward<Range>(ranges))
            );
    }